

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-term.c
# Opt level: O3

errr Term_resize(wchar_t w,wchar_t h)

{
  size_t len;
  uint16_t uVar1;
  int *piVar2;
  int *piVar3;
  term_win *ptVar4;
  term_win *f;
  term_win *f_00;
  term_win *ptVar5;
  errr eVar6;
  int *piVar7;
  term_win *ptVar8;
  term_win *ptVar9;
  term *ptVar10;
  ulong uVar11;
  wchar_t h_00;
  wchar_t w_00;
  term_win **pptVar12;
  
  eVar6 = -1;
  if ((Term->fixed_shape == false) && (L'\0' < h && L'\0' < w)) {
    w_00 = Term->wid;
    h_00 = Term->hgt;
    eVar6 = 1;
    if (h_00 != h || w_00 != w) {
      if (w <= w_00) {
        w_00 = w;
      }
      if (h <= h_00) {
        h_00 = h;
      }
      piVar2 = Term->x1;
      piVar3 = Term->x2;
      ptVar4 = Term->old;
      f = Term->scr;
      ptVar9 = Term->mem;
      f_00 = Term->tmp;
      len = (ulong)(uint)h * 4;
      piVar7 = (int *)mem_zalloc(len);
      Term->x1 = piVar7;
      piVar7 = (int *)mem_zalloc(len);
      Term->x2 = piVar7;
      ptVar8 = (term_win *)mem_zalloc(0x60);
      Term->old = ptVar8;
      term_win_init(ptVar8,w,h);
      term_win_copy(Term->old,ptVar4,w_00,h_00);
      ptVar8 = (term_win *)mem_zalloc(0x60);
      Term->scr = ptVar8;
      term_win_init(ptVar8,w,h);
      term_win_copy(Term->scr,f,w_00,h_00);
      if (ptVar9 != (term_win *)0x0) {
        pptVar12 = &Term->mem;
        do {
          ptVar8 = (term_win *)mem_zalloc(0x60);
          *pptVar12 = ptVar8;
          term_win_init(ptVar8,w,h);
          term_win_copy(*pptVar12,ptVar9,w_00,h_00);
          ptVar8 = ptVar9->next;
          ptVar5 = *pptVar12;
          if (w <= ptVar5->cx) {
            ptVar5->cu = true;
          }
          if (h <= ptVar5->cy) {
            ptVar5->cu = true;
          }
          pptVar12 = &ptVar5->next;
          term_win_nuke(ptVar9);
          mem_free(ptVar9);
          ptVar9 = ptVar8;
        } while (ptVar8 != (term_win *)0x0);
      }
      if (f_00 != (term_win *)0x0) {
        ptVar9 = (term_win *)mem_zalloc(0x60);
        Term->tmp = ptVar9;
        term_win_init(ptVar9,w,h);
        term_win_copy(Term->tmp,f_00,w_00,h_00);
      }
      mem_free(piVar2);
      mem_free(piVar3);
      term_win_nuke(ptVar4);
      mem_free(ptVar4);
      ptVar4 = Term->old;
      if (w <= ptVar4->cx) {
        ptVar4->cu = true;
      }
      if (h <= ptVar4->cy) {
        ptVar4->cu = true;
      }
      term_win_nuke(f);
      mem_free(f);
      ptVar10 = Term;
      ptVar4 = Term->scr;
      if (w <= ptVar4->cx) {
        ptVar4->cu = true;
      }
      if (h <= ptVar4->cy) {
        ptVar4->cu = true;
      }
      if (f_00 != (term_win *)0x0) {
        term_win_nuke(f_00);
        mem_free(f_00);
        ptVar10 = Term;
        ptVar4 = Term->tmp;
        if (w <= ptVar4->cx) {
          ptVar4->cu = true;
        }
        if (h <= ptVar4->cy) {
          ptVar4->cu = true;
        }
      }
      ptVar10->wid = w;
      ptVar10->hgt = h;
      ptVar10->total_erase = true;
      piVar2 = ptVar10->x1;
      piVar3 = ptVar10->x2;
      uVar11 = 0;
      do {
        piVar2[uVar11] = 0;
        piVar3[uVar11] = w + L'\xffffffff';
        uVar11 = uVar11 + 1;
      } while ((uint)h != uVar11);
      ptVar10->y1 = 0;
      ptVar10->y2 = h + L'\xffffffff';
      uVar1 = ptVar10->key_tail;
      if (uVar1 == 0) {
        uVar1 = ptVar10->key_size;
      }
      ptVar10->key_tail = uVar1 - 1;
      ptVar10->key_queue[(ushort)(uVar1 - 1)].type = EVT_RESIZE;
      eVar6 = 0;
    }
  }
  return eVar6;
}

Assistant:

errr Term_resize(int w, int h)
{
	int i;

	int wid, hgt;

	int *hold_x1;
	int *hold_x2;

	term_win *hold_old;
	term_win *hold_scr;
	term_win *hold_mem;
	term_win **hold_mem_dest;
	term_win *hold_tmp;

	ui_event evt = EVENT_EMPTY;
	evt.type = EVT_RESIZE;

	/* Resizing is forbidden */
	if (Term->fixed_shape) return (-1);

	/* Ignore illegal changes */
	if ((w < 1) || (h < 1)) return (-1);

	/* Ignore non-changes */
	if ((Term->wid == w) && (Term->hgt == h)) return (1);

	/* Minimum dimensions */
	wid = MIN(Term->wid, w);
	hgt = MIN(Term->hgt, h);

	/* Save scanners */
	hold_x1 = Term->x1;
	hold_x2 = Term->x2;

	/* Save old window */
	hold_old = Term->old;

	/* Save old window */
	hold_scr = Term->scr;

	/* Save old window */
	hold_mem = Term->mem;

	/* Save old window */
	hold_tmp = Term->tmp;

	/* Create new scanners */
	Term->x1 = mem_zalloc(h * sizeof(int));
	Term->x2 = mem_zalloc(h * sizeof(int));

	/* Create new window */
	Term->old = mem_zalloc(sizeof(term_win));

	/* Initialize new window */
	term_win_init(Term->old, w, h);

	/* Save the contents */
	term_win_copy(Term->old, hold_old, wid, hgt);

	/* Create new window */
	Term->scr = mem_zalloc(sizeof(term_win));

	/* Initialize new window */
	term_win_init(Term->scr, w, h);

	/* Save the contents */
	term_win_copy(Term->scr, hold_scr, wid, hgt);

	/* If needed */
	hold_mem_dest = &Term->mem;
	while (hold_mem != 0) {
		term_win* trash;

		/* Create new window */
		*hold_mem_dest = mem_zalloc(sizeof(term_win));

		/* Initialize new window */
		term_win_init(*hold_mem_dest, w, h);

		/* Save the contents */
		term_win_copy(*hold_mem_dest, hold_mem, wid, hgt);

		trash = hold_mem;
		hold_mem = hold_mem->next;

		if ((*hold_mem_dest)->cx >= w) (*hold_mem_dest)->cu = 1;
		if ((*hold_mem_dest)->cy >= h) (*hold_mem_dest)->cu = 1;

		hold_mem_dest = &((*hold_mem_dest)->next);

		term_win_nuke(trash);
		mem_free(trash);
	}

	/* If needed */
	if (hold_tmp) {
		/* Create new window */
		Term->tmp = mem_zalloc(sizeof(term_win));

		/* Initialize new window */
		term_win_init(Term->tmp, w, h);

		/* Save the contents */
		term_win_copy(Term->tmp, hold_tmp, wid, hgt);
	}

	/* Free some arrays */
	mem_free(hold_x1);
	mem_free(hold_x2);

	/* Nuke */
	term_win_nuke(hold_old);

	/* Kill */
	mem_free(hold_old);

	/* Illegal cursor */
	if (Term->old->cx >= w) Term->old->cu = 1;
	if (Term->old->cy >= h) Term->old->cu = 1;

	/* Nuke */
	term_win_nuke(hold_scr);

	/* Kill */
	mem_free(hold_scr);

	/* Illegal cursor */
	if (Term->scr->cx >= w) Term->scr->cu = 1;
	if (Term->scr->cy >= h) Term->scr->cu = 1;

	/* If needed */
	if (hold_tmp) {
		/* Nuke */
		term_win_nuke(hold_tmp);

		/* Kill */
		mem_free(hold_tmp);

		/* Illegal cursor */
		if (Term->tmp->cx >= w) Term->tmp->cu = 1;
		if (Term->tmp->cy >= h) Term->tmp->cu = 1;
	}

	/* Save new size */
	Term->wid = w;
	Term->hgt = h;

	/* Force "total erase" */
	Term->total_erase = true;

	/* Assume change */
	for (i = 0; i < h; i++) {
		/* Assume change */
		Term->x1[i] = 0;
		Term->x2[i] = w - 1;
	}

	/* Assume change */
	Term->y1 = 0;
	Term->y2 = h - 1;

	/* Push a resize event onto the stack */
	Term_event_push(&evt);

	/* Success */
	return (0);
}